

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOrder.c
# Opt level: O3

void Aig_ObjOrderRemove(Aig_Man_t *p,int ObjId)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  
  if (ObjId == 0) {
    __assert_fail("ObjId != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigOrder.c"
                  ,0x85,"void Aig_ObjOrderRemove(Aig_Man_t *, int)");
  }
  if ((-1 < ObjId) && (ObjId < p->vObjs->nSize)) {
    uVar4 = (ulong)(uint)ObjId;
    if (0xfffffffd < (*(uint *)((long)p->vObjs->pArray[uVar4] + 0x18) & 7) - 7) {
      puVar3 = p->pOrderData;
      uVar1 = puVar3[(uint)(ObjId * 2)];
      uVar2 = puVar3[uVar4 * 2 + 1];
      puVar3[(uint)(ObjId * 2)] = 0xffffffff;
      puVar3[uVar4 * 2 + 1] = 0xffffffff;
      puVar3[(long)(int)uVar2 * 2] = uVar1;
      puVar3[(long)(int)uVar1 * 2 + 1] = uVar2;
      if (p->iPrev == ObjId) {
        p->nAndPrev = p->nAndPrev + -1;
        p->iPrev = uVar1;
      }
      if (p->iNext == ObjId) {
        p->iNext = uVar2;
      }
      p->nAndTotal = p->nAndTotal + -1;
      return;
    }
    __assert_fail("Aig_ObjIsNode( Aig_ManObj(p, ObjId) )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigOrder.c"
                  ,0x86,"void Aig_ObjOrderRemove(Aig_Man_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Aig_ObjOrderRemove( Aig_Man_t * p, int ObjId )
{
    int iPrev, iNext;
    assert( ObjId != 0 );
    assert( Aig_ObjIsNode( Aig_ManObj(p, ObjId) ) );
    iPrev = p->pOrderData[2*ObjId];
    iNext = p->pOrderData[2*ObjId+1];
    p->pOrderData[2*ObjId] = 0xFFFFFFFF;
    p->pOrderData[2*ObjId+1] = 0xFFFFFFFF;
    p->pOrderData[2*iNext] = iPrev;
    p->pOrderData[2*iPrev+1] = iNext;
    if ( p->iPrev == ObjId )
    {
        p->nAndPrev--;
        p->iPrev = iPrev;
    }
    if ( p->iNext == ObjId )
        p->iNext = iNext;
    p->nAndTotal--;
}